

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

boolean rob_shop(monst *shkp)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  int *piVar5;
  boolean bVar6;
  
  rouse_shk(shkp,'\x01');
  iVar4 = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2);
  if (iVar4 == 0) {
    lVar2 = 0;
  }
  else {
    piVar5 = (int *)(*(long *)&shkp[0x1b].mnum + 0xc);
    lVar2 = 0;
    do {
      lVar2 = lVar2 + (long)*piVar5 * (long)piVar5[-1];
      piVar5 = piVar5 + 4;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  lVar2 = *(int *)&shkp[0x1b].field_0x60 + lVar2;
  uVar1 = shkp[0x1b].mappearance;
  if ((int)uVar1 < lVar2) {
    bVar6 = '\0';
    pline("You escaped the shop without paying!");
    uVar1 = shkp[0x1b].mappearance;
    setpaid(shkp);
    lVar2 = lVar2 - (int)uVar1;
    if (lVar2 != 0) {
      *(int *)&shkp[0x1b].mtame = *(int *)&shkp[0x1b].mtame + (int)lVar2;
      pcVar3 = currency(lVar2);
      pline("You stole %ld %s worth of merchandise.",lVar2,pcVar3);
      if (urole.malenum != 0x164) {
        iVar4 = sgn((int)u.ualign.type);
        adjalign(-iVar4);
      }
      hot_pursuit(shkp);
      bVar6 = '\x01';
    }
  }
  else {
    pcVar3 = currency((long)(int)uVar1);
    bVar6 = '\0';
    pline("Your credit of %ld %s is used to cover your shopping bill.",(ulong)uVar1,pcVar3);
    setpaid(shkp);
  }
  return bVar6;
}

Assistant:

static boolean rob_shop(struct monst *shkp)
{
	struct eshk *eshkp;
	long total;

	eshkp = ESHK(shkp);
	rouse_shk(shkp, TRUE);
	total = (addupbill(shkp) + eshkp->debit);
	if (eshkp->credit >= total) {
	    pline("Your credit of %ld %s is used to cover your shopping bill.",
		 eshkp->credit, currency(eshkp->credit));
	    total = 0L;		/* credit gets cleared by setpaid() */
	} else {
	    pline("You escaped the shop without paying!");
	    total -= eshkp->credit;
	}
	setpaid(shkp);
	if (!total) return FALSE;

	/* by this point, we know an actual robbery has taken place */
	eshkp->robbed += total;
	pline("You stole %ld %s worth of merchandise.",
	    total, currency(total));
	if (!Role_if (PM_ROGUE))	/* stealing is unlawful */
	    adjalign(-sgn(u.ualign.type));

	hot_pursuit(shkp);
	return TRUE;
}